

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void parse_assign(Parser *psr)

{
  uint64_t uVar1;
  undefined1 dest_00;
  Node NVar2;
  Node right;
  undefined1 local_48 [8];
  Node dest_node;
  Node result;
  int local_20;
  Tk augmented_tk;
  int i;
  int dest;
  uint64_t name;
  Parser *psr_local;
  
  uVar1 = (psr->lxr).tk.field_4.ident_hash;
  lex_next(&psr->lxr);
  augmented_tk = -1;
  local_20 = psr->scope->first_local;
  do {
    if (psr->locals_count <= local_20) {
LAB_001194fc:
      if (augmented_tk != -1) {
        switch((psr->lxr).tk.type) {
        case 0x101:
          result.field_1.jmp.false_list = 0x2b;
          break;
        case 0x102:
          result.field_1.jmp.false_list = 0x2d;
          break;
        case 0x103:
          result.field_1.jmp.false_list = 0x2a;
          break;
        case 0x104:
          result.field_1.jmp.false_list = 0x2f;
          break;
        default:
          result.field_1.jmp.false_list = 0;
        }
        lex_next(&psr->lxr);
        NVar2 = parse_expr(psr);
        dest_node.field_1.prim = NVar2.type;
        dest_00 = (undefined1)augmented_tk;
        if (result.field_1.jmp.false_list == 0) {
          expr_to_slot(psr,dest_00,(Node *)&dest_node.field_1.jmp);
        }
        else {
          local_48._0_4_ = NODE_NON_RELOC;
          right._4_4_ = 0;
          right.type = dest_node.field_1.prim;
          right.field_1 = NVar2.field_1;
          dest_node.type._0_1_ = dest_00;
          expr_emit_arith(psr,result.field_1.jmp.false_list,(Node *)local_48,right);
          expr_to_slot(psr,dest_00,(Node *)local_48);
        }
        return;
      }
      psr_trigger_err(psr,"variable not defined");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                    ,0x533,"void parse_assign(Parser *)");
    }
    if (psr->locals[local_20].name == uVar1) {
      augmented_tk = local_20 - psr->scope->first_local;
      goto LAB_001194fc;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

static void parse_assign(Parser *psr) {
	// Get the name of the variable to assign to
	uint64_t name = psr->lxr.tk.ident_hash;
	lex_next(&psr->lxr);

	// Check the variable exists
	int dest = -1;
	for (int i = psr->scope->first_local; i < psr->locals_count; i++) {
		if (psr->locals[i].name == name) {
			dest = i - psr->scope->first_local;
			break;
		}
	}

	// Assignment destination doesn't exist
	if (dest == -1) {
		psr_trigger_err(psr, "variable not defined");
		UNREACHABLE();
	}

	// Check for an augmented assignment
	Tk augmented_tk;
	switch (psr->lxr.tk.type) {
		case TK_ADD_ASSIGN: augmented_tk = '+'; break;
		case TK_SUB_ASSIGN: augmented_tk = '-'; break;
		case TK_MUL_ASSIGN: augmented_tk = '*'; break;
		case TK_DIV_ASSIGN: augmented_tk = '/'; break;
		default: augmented_tk = '\0'; break;
	}
	lex_next(&psr->lxr);

	// Expect an expression
	Node result = parse_expr(psr);

	// Handle an augmented assignment
	if (augmented_tk != '\0') {
		// Emit a relocatable arithmetic instruction for the assignment
		Node dest_node;
		dest_node.type = NODE_NON_RELOC;
		dest_node.slot = (uint8_t) dest;
		expr_emit_arith(psr, augmented_tk, &dest_node, result);

		// Set the destination of the relocatable instruction
		expr_to_slot(psr, (uint8_t) dest, &dest_node);
	} else {
		// Put the assignment result into the correct slot
		expr_to_slot(psr, (uint8_t) dest, &result);
	}
}